

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O1

string * __thiscall
duckdb::TupleDataCollection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TupleDataCollection *this)

{
  undefined8 *puVar1;
  bool bVar2;
  TupleDataSegment *segment;
  pointer pTVar3;
  undefined8 *puVar4;
  string *psVar5;
  unsigned_long params;
  undefined8 uVar6;
  unsigned_long in_R8;
  unsigned_long in_R9;
  string *result;
  DataChunk chunk;
  TupleDataScanState scan_state;
  undefined8 *local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  string local_2e8;
  string local_2c8;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  Exception local_288;
  undefined1 local_278 [16];
  DataChunk local_268;
  undefined1 local_228 [24];
  undefined1 auStack_210 [24];
  TupleDataPinProperties local_1f8;
  TupleDataChunkState local_1f0;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  DataChunk::DataChunk(&local_268);
  InitializeChunk(this,&local_268);
  auStack_210._8_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffde8 = (undefined1  [16])0x0;
  local_228._0_16_ = (undefined1  [16])0x0;
  local_1f8 = INVALID;
  TupleDataChunkState::TupleDataChunkState(&local_1f0);
  local_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  uStack_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  InitializeScan(this,(TupleDataScanState *)local_228,UNPIN_AFTER_DONE);
  local_288._0_8_ = local_278;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"TupleDataCollection - [%llu Chunks, %llu Rows]\n","");
  psVar5 = (string *)0x0;
  for (pTVar3 = (this->segments).
                super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
                super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar3 != (this->segments).
                super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
                super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
    psVar5 = (string *)
             ((long)psVar5 +
             ((long)(pTVar3->chunks).
                    super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                    super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pTVar3->chunks).
                    super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                    super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  }
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (__return_storage_ptr__,&local_288,psVar5,this->count,in_R8);
  if ((undefined1 *)local_288._0_8_ != local_278) {
    operator_delete((void *)local_288._0_8_);
  }
  psVar5 = (string *)0x0;
  params = 0;
  do {
    bVar2 = Scan(this,(TupleDataScanState *)local_228,&local_268);
    if (!bVar2) {
      TupleDataChunkState::~TupleDataChunkState(&local_1f0);
      ::std::
      vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
                 *)auStack_210);
      ::std::
      vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
                 *)local_228);
      DataChunk::~DataChunk(&local_268);
      return __return_storage_ptr__;
    }
    local_2a8[0] = local_298;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,"Chunk %llu - [Rows %llu - %llu]\n","");
    Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
              (&local_2c8,(Exception *)local_2a8,psVar5,params,local_268.count + params,in_R9);
    DataChunk::ToString_abi_cxx11_(&local_2e8,&local_268);
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      uVar6 = local_2c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_2e8._M_string_length + local_2c8._M_string_length) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        uVar6 = local_2e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_2e8._M_string_length + local_2c8._M_string_length) goto LAB_012f5d50;
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_2e8,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
    }
    else {
LAB_012f5d50:
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_2c8,(ulong)local_2e8._M_dataplus._M_p);
    }
    puVar1 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar1) {
      local_2f8 = *puVar1;
      uStack_2f0 = puVar4[3];
      local_308 = &local_2f8;
    }
    else {
      local_2f8 = *puVar1;
      local_308 = (undefined8 *)*puVar4;
    }
    *puVar4 = puVar1;
    puVar4[1] = 0;
    *(undefined1 *)puVar1 = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_308);
    if (local_308 != &local_2f8) {
      operator_delete(local_308);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0]);
    }
    psVar5 = (string *)((long)&(psVar5->_M_dataplus)._M_p + 1);
    params = params + local_268.count;
  } while( true );
}

Assistant:

string TupleDataCollection::ToString() {
	DataChunk chunk;
	InitializeChunk(chunk);

	TupleDataScanState scan_state;
	InitializeScan(scan_state);

	string result = StringUtil::Format("TupleDataCollection - [%llu Chunks, %llu Rows]\n", ChunkCount(), Count());
	idx_t chunk_idx = 0;
	idx_t row_count = 0;
	while (Scan(scan_state, chunk)) {
		result +=
		    StringUtil::Format("Chunk %llu - [Rows %llu - %llu]\n", chunk_idx, row_count, row_count + chunk.size()) +
		    chunk.ToString();
		chunk_idx++;
		row_count += chunk.size();
	}

	return result;
}